

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementNSImpl.cpp
# Opt level: O0

int __thiscall xercesc_4_0::DOMElementNSImpl::rename(DOMElementNSImpl *this,char *__old,char *__new)

{
  DOMAttrMapImpl *this_00;
  int iVar1;
  undefined4 extraout_var;
  DOMNodeImpl *this_01;
  XMLCh *name_local;
  XMLCh *namespaceURI_local;
  DOMElementNSImpl *this_local;
  
  setName(this,(XMLCh *)__old,(XMLCh *)__new);
  this_00 = (this->super_DOMElementImpl).fAttributes;
  iVar1 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0x4a])();
  DOMAttrMapImpl::reconcileDefaultAttributes(this_00,(DOMAttrMapImpl *)CONCAT44(extraout_var,iVar1))
  ;
  this_01 = xercesc_4_0::castToNodeImpl((DOMNode *)this);
  DOMNodeImpl::callUserDataHandlers(this_01,NODE_RENAMED,(DOMNode *)this,(DOMNode *)this);
  return (int)this;
}

Assistant:

DOMNode* DOMElementNSImpl::rename(const XMLCh* namespaceURI, const XMLCh* name)
{
    setName(namespaceURI, name);
    fAttributes->reconcileDefaultAttributes(getDefaultAttributes());
    // and fire user data NODE_RENAMED event
    castToNodeImpl(this)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, this);

    return this;
}